

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

void helper_vmsumshs_ppc64
               (CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  int aiStack_38 [4];
  int32_t prod [8];
  
  lVar2 = 0;
  do {
    aiStack_38[lVar2] = (int)b->s16[lVar2] * (int)a->s16[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  bVar1 = false;
  lVar2 = 3;
  do {
    lVar4 = (long)aiStack_38[lVar2 * 2 + 1] + (long)aiStack_38[lVar2 * 2] + (long)c->s32[lVar2];
    lVar3 = 0x7fffffff;
    if (lVar4 < 0x7fffffff) {
      lVar3 = lVar4;
    }
    if ((int)lVar4 != lVar4) {
      bVar1 = true;
    }
    if (lVar3 < -0x7fffffff) {
      lVar3 = -0x80000000;
    }
    r->u32[lVar2] = (uint32_t)lVar3;
    bVar5 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar5);
  if (bVar1) {
    (env->vscr_sat).u32[0] = 1;
  }
  return;
}

Assistant:

void helper_vmsumshs(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    int32_t prod[8];
    int i;
    int sat = 0;

    for (i = 0; i < ARRAY_SIZE(r->s16); i++) {
        prod[i] = (int32_t)a->s16[i] * b->s16[i];
    }

    VECTOR_FOR_INORDER_I(i, s32) {
        int64_t t = (int64_t)c->s32[i] + prod[2 * i] + prod[2 * i + 1];

        r->u32[i] = cvtsdsw(t, &sat);
    }

    if (sat) {
        set_vscr_sat(env);
    }
}